

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall
ObjectModelBuilder::buildObject(ObjectModelBuilder *this,value *value,Object *parent,Class *clazz)

{
  long lVar1;
  const_iterator this_00;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  ostream *poVar6;
  ulong uVar7;
  Object *this_01;
  pointer ppVar8;
  reference ppVar9;
  reference pPVar10;
  double *pdVar11;
  _Base_ptr this_02;
  Binding *this_03;
  element_type *peVar12;
  string *psVar13;
  element_type *this_04;
  mapped_type *pmVar14;
  pointer ppVar15;
  value *this_05;
  array *paVar16;
  reference pvVar17;
  size_type sVar18;
  void *this_06;
  bool local_484;
  bool local_481;
  Object *local_380;
  Object *p;
  string padding;
  value child;
  const_iterator __end3;
  const_iterator __begin3;
  array *__range3;
  value *children;
  allocator local_319;
  key_type local_318;
  _Self local_2f8;
  const_iterator childrenIt;
  undefined1 local_2b0 [8];
  value i;
  const_iterator __end7;
  const_iterator __begin7;
  array *__range7;
  shared_ptr<Binding> binding_1;
  _Self local_270;
  allocator local_261;
  key_type local_260;
  _Self local_240;
  const_iterator to;
  key_type local_230;
  _Self local_210;
  const_iterator bind;
  object *binding;
  Value local_1c0;
  value *local_180;
  value *propertyValue;
  Property classProperty;
  iterator __end2;
  iterator __begin2;
  vector<Property,_std::allocator<Property>_> *__range2;
  bool exists;
  string *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  member;
  const_iterator __end1;
  const_iterator __begin1;
  object *__range1;
  _Self local_b8;
  iterator classIt;
  Object *instance;
  undefined1 local_88 [8];
  string id;
  undefined1 local_58 [8];
  string typeName;
  object *object;
  Class *clazz_local;
  Object *parent_local;
  value *value_local;
  ObjectModelBuilder *this_local;
  
  bVar3 = picojson::value::
          is<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                    (value);
  if (!bVar3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"error: \'root\' entry in class=\'");
    poVar6 = std::operator<<(poVar6,(string *)clazz);
    poVar6 = std::operator<<(poVar6,"\' is not a JSON object...");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
    goto LAB_00130f2b;
  }
  typeName.field_2._8_8_ =
       picojson::value::
       get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                 (value);
  findStringInObject((string *)local_58,(object *)typeName.field_2._8_8_,"class");
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    findStringInObject((string *)&instance,(object *)typeName.field_2._8_8_,"id");
    uniqueIdentifier((string *)local_88,this,clazz,(string *)&instance);
    std::__cxx11::string::~string((string *)&instance);
    this_01 = (Object *)operator_new(0x78);
    (this_01->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_01->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
    ;
    (this_01->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (this_01->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this_01->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&(this_01->propertyValues)._M_t._M_impl = 0;
    *(undefined8 *)&(this_01->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (this_01->id).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(this_01->id).field_2 + 8) = 0;
    *(undefined8 *)&this_01->id = 0;
    (this_01->id)._M_string_length = 0;
    this_01->clazz = (Class *)0x0;
    this_01->parent = (Object *)0x0;
    (this_01->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Object::Object(this_01);
    this_01->parent = parent;
    classIt._M_node = (_Base_ptr)this_01;
    std::__cxx11::string::operator=((string *)&this_01->id,(string *)local_88);
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
         ::find(&this->m_classes,(key_type *)local_58);
    __range1 = (object *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
               ::end(&this->m_classes);
    bVar3 = std::operator==(&local_b8,(_Self *)&__range1);
    if (bVar3) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"error: unknown class=");
      poVar6 = std::operator<<(poVar6,(string *)local_58);
      poVar6 = std::operator<<(poVar6,", for object id=");
      poVar6 = std::operator<<(poVar6,(string *)local_88);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
      id.field_2._8_4_ = 1;
      goto LAB_00130eff;
    }
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>
             ::operator->(&local_b8);
    uVar2 = typeName.field_2._8_8_;
    *(Class **)classIt._M_node = ppVar8->second;
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                      *)typeName.field_2._8_8_);
    member.second.u_ =
         (_storage)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                *)uVar2);
    while (bVar3 = std::operator!=(&__end1,(_Self *)&member.second.u_),
          uVar2 = typeName.field_2._8_8_, bVar3) {
      ppVar9 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
               ::operator*(&__end1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
              *)&key,ppVar9);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &key,"children");
      if (((bVar3) ||
          (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&key,"id"), bVar3)) ||
         (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&key,"class"), bVar3)) {
        id.field_2._8_4_ = 3;
      }
      else {
        bVar3 = false;
        lVar1 = *(long *)classIt._M_node;
        __end2 = std::vector<Property,_std::allocator<Property>_>::begin
                           ((vector<Property,_std::allocator<Property>_> *)(lVar1 + 0x60));
        classProperty.type.field_2._8_8_ =
             std::vector<Property,_std::allocator<Property>_>::end
                       ((vector<Property,_std::allocator<Property>_> *)(lVar1 + 0x60));
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>
                                           *)((long)&classProperty.type.field_2 + 8)), bVar4) {
          pPVar10 = __gnu_cxx::
                    __normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>
                    ::operator*(&__end2);
          Property::Property((Property *)&propertyValue,pPVar10);
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&classProperty,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&key);
          if (_Var5) {
            bVar3 = true;
            id.field_2._8_4_ = 4;
          }
          else {
            id.field_2._8_4_ = 0;
          }
          Property::~Property((Property *)&propertyValue);
          if (id.field_2._8_4_ != 0) break;
          __gnu_cxx::
          __normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>::
          operator++(&__end2);
        }
        if (bVar3) {
          local_180 = (value *)((long)&member.first.field_2 + 8);
          bVar3 = picojson::value::is<double>(local_180);
          if (bVar3) {
            pdVar11 = picojson::value::get<double>(local_180);
            Value::number(&local_1c0,*pdVar11);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                                    *)&classIt._M_node[1]._M_left,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&key);
            Value::operator=(pmVar14,&local_1c0);
            Value::~Value(&local_1c0);
          }
          else {
            bVar3 = picojson::value::is<std::__cxx11::string>(local_180);
            if (bVar3) {
              psVar13 = picojson::value::get<std::__cxx11::string>(local_180);
              Value::string((Value *)&binding,psVar13);
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                                      *)&classIt._M_node[1]._M_left,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&key);
              Value::operator=(pmVar14,(Value *)&binding);
              Value::~Value((Value *)&binding);
            }
            else {
              bVar3 = picojson::value::
                      is<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                                (local_180);
              if (bVar3) {
                this_02 = (_Base_ptr)
                          picojson::value::
                          get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                                    (local_180);
                bind._M_node = this_02;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_230,"bind",(allocator *)((long)&to._M_node + 7));
                local_210._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                     ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                             *)this_02,&local_230);
                std::__cxx11::string::~string((string *)&local_230);
                std::allocator<char>::~allocator((allocator<char> *)((long)&to._M_node + 7));
                this_00 = bind;
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_260,"to",&local_261);
                local_240._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                     ::find(this_00._M_node,&local_260);
                std::__cxx11::string::~string((string *)&local_260);
                std::allocator<char>::~allocator((allocator<char> *)&local_261);
                local_270._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                     ::end(bind._M_node);
                bVar3 = std::operator!=(&local_210,&local_270);
                local_481 = false;
                if (bVar3) {
                  ppVar15 = std::
                            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                            ::operator->(&local_210);
                  bVar3 = picojson::value::is<std::__cxx11::string>(&ppVar15->second);
                  local_481 = false;
                  if (bVar3) {
                    binding_1.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                                   *)bind._M_node);
                    bVar3 = std::operator!=(&local_240,
                                            (_Self *)&binding_1.
                                                                                                            
                                                  super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                    local_481 = false;
                    if (bVar3) {
                      ppVar15 = std::
                                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                                ::operator->(&local_240);
                      bVar3 = picojson::value::is<std::__cxx11::string>(&ppVar15->second);
                      local_484 = true;
                      if (!bVar3) {
                        ppVar15 = std::
                                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                                  ::operator->(&local_240);
                        local_484 = picojson::value::
                                    is<std::vector<picojson::value,std::allocator<picojson::value>>>
                                              (&ppVar15->second);
                      }
                      local_481 = local_484;
                    }
                  }
                }
                if (local_481 == false) {
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "error: malformed binding in object id=");
                  poVar6 = std::operator<<(poVar6,(string *)local_88);
                  poVar6 = std::operator<<(poVar6,", class=");
                  poVar6 = std::operator<<(poVar6,(string *)local_58);
                  poVar6 = std::operator<<(poVar6,", property=");
                  poVar6 = std::operator<<(poVar6,(string *)&key);
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  this_local._7_1_ = 0;
                  id.field_2._8_4_ = 1;
                  goto LAB_001309ad;
                }
                this_03 = (Binding *)operator_new(0x38);
                (this_03->dependencies).
                super__Vector_base<Binding::Dependency,_std::allocator<Binding::Dependency>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (this_03->dependencies).
                super__Vector_base<Binding::Dependency,_std::allocator<Binding::Dependency>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (this_03->expression).field_2._M_allocated_capacity = 0;
                *(undefined8 *)((long)&(this_03->expression).field_2 + 8) = 0;
                *(undefined8 *)&this_03->expression = 0;
                (this_03->expression)._M_string_length = 0;
                (this_03->dependencies).
                super__Vector_base<Binding::Dependency,_std::allocator<Binding::Dependency>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                Binding::Binding(this_03);
                std::shared_ptr<Binding>::shared_ptr<Binding,void>
                          ((shared_ptr<Binding> *)&__range7,this_03);
                ppVar15 = std::
                          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                          ::operator->(&local_240);
                bVar3 = picojson::value::is<std::__cxx11::string>(&ppVar15->second);
                if (bVar3) {
                  peVar12 = std::__shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>::get
                                      ((__shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2> *)
                                       &__range7);
                  ppVar15 = std::
                            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                            ::operator->(&local_240);
                  psVar13 = picojson::value::get<std::__cxx11::string>(&ppVar15->second);
                  bVar3 = buildBindingDependency
                                    (this,peVar12,psVar13,(Object *)classIt._M_node,clazz);
                  if (bVar3) goto LAB_001307fc;
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "error: malformed binding dependency=");
                  ppVar15 = std::
                            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                            ::operator->(&local_240);
                  psVar13 = picojson::value::get<std::__cxx11::string>(&ppVar15->second);
                  poVar6 = std::operator<<(poVar6,(string *)psVar13);
                  poVar6 = std::operator<<(poVar6,", in object id=");
                  poVar6 = std::operator<<(poVar6,(string *)local_88);
                  poVar6 = std::operator<<(poVar6,", class=");
                  poVar6 = std::operator<<(poVar6,(string *)local_58);
                  poVar6 = std::operator<<(poVar6,", property=");
                  poVar6 = std::operator<<(poVar6,(string *)&key);
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  this_local._7_1_ = 0;
                  id.field_2._8_4_ = 1;
                }
                else {
                  ppVar15 = std::
                            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                            ::operator->(&local_240);
                  paVar16 = picojson::value::
                            get<std::vector<picojson::value,std::allocator<picojson::value>>>
                                      (&ppVar15->second);
                  __end7 = std::vector<picojson::value,_std::allocator<picojson::value>_>::begin
                                     (paVar16);
                  i.u_ = (_storage)
                         std::vector<picojson::value,_std::allocator<picojson::value>_>::end
                                   (paVar16);
                  while (bVar3 = __gnu_cxx::operator!=
                                           (&__end7,(
                                                  __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                                                  *)&i.u_), bVar3) {
                    pvVar17 = __gnu_cxx::
                              __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                              ::operator*(&__end7);
                    picojson::value::value((value *)local_2b0,pvVar17);
                    bVar3 = picojson::value::is<std::__cxx11::string>((value *)local_2b0);
                    if (bVar3) {
                      peVar12 = std::__shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>::get
                                          ((__shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2> *)
                                           &__range7);
                      psVar13 = picojson::value::get<std::__cxx11::string>((value *)local_2b0);
                      bVar3 = buildBindingDependency
                                        (this,peVar12,psVar13,(Object *)classIt._M_node,clazz);
                      if (bVar3) {
                        id.field_2._8_4_ = 0;
                      }
                      else {
                        poVar6 = std::operator<<((ostream *)&std::cerr,
                                                 "error: malformed binding dependency=");
                        psVar13 = picojson::value::get<std::__cxx11::string>((value *)local_2b0);
                        poVar6 = std::operator<<(poVar6,(string *)psVar13);
                        poVar6 = std::operator<<(poVar6,", in object id=");
                        poVar6 = std::operator<<(poVar6,(string *)local_88);
                        poVar6 = std::operator<<(poVar6,", class=");
                        poVar6 = std::operator<<(poVar6,(string *)local_58);
                        poVar6 = std::operator<<(poVar6,", property=");
                        poVar6 = std::operator<<(poVar6,(string *)&key);
                        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                        this_local._7_1_ = 0;
                        id.field_2._8_4_ = 1;
                      }
                    }
                    else {
                      poVar6 = std::operator<<((ostream *)&std::cerr,
                                               "error: binding dependency needs to be a JSON string, id="
                                              );
                      poVar6 = std::operator<<(poVar6,(string *)local_88);
                      poVar6 = std::operator<<(poVar6,", property=");
                      poVar6 = std::operator<<(poVar6,(string *)&key);
                      poVar6 = std::operator<<(poVar6,", class=");
                      poVar6 = std::operator<<(poVar6,(string *)local_58);
                      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                      this_local._7_1_ = 0;
                      id.field_2._8_4_ = 1;
                    }
                    picojson::value::~value((value *)local_2b0);
                    if (id.field_2._8_4_ != 0) goto LAB_00130895;
                    __gnu_cxx::
                    __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                    ::operator++(&__end7);
                  }
LAB_001307fc:
                  ppVar15 = std::
                            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                            ::operator->(&local_210);
                  psVar13 = picojson::value::get<std::__cxx11::string>(&ppVar15->second);
                  this_04 = std::
                            __shared_ptr_access<Binding,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                            operator->((__shared_ptr_access<Binding,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&__range7);
                  std::__cxx11::string::operator=((string *)this_04,(string *)psVar13);
                  Value::binding((Value *)&childrenIt,(shared_ptr<Binding> *)&__range7);
                  pmVar14 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                                          *)&classIt._M_node[1]._M_left,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&key);
                  Value::operator=(pmVar14,(Value *)&childrenIt);
                  Value::~Value((Value *)&childrenIt);
                  id.field_2._8_4_ = 0;
                }
LAB_00130895:
                std::shared_ptr<Binding>::~shared_ptr((shared_ptr<Binding> *)&__range7);
                if (id.field_2._8_4_ != 0) goto LAB_001309ad;
              }
            }
          }
          id.field_2._8_4_ = 0;
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,"error: object id=");
          poVar6 = std::operator<<(poVar6,(string *)local_88);
          poVar6 = std::operator<<(poVar6,", class=");
          poVar6 = std::operator<<(poVar6,(string *)local_58);
          poVar6 = std::operator<<(poVar6,", unknown property=");
          poVar6 = std::operator<<(poVar6,(string *)&key);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = 0;
          id.field_2._8_4_ = 1;
        }
      }
LAB_001309ad:
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
               *)&key);
      if ((id.field_2._8_4_ != 0) && (id.field_2._8_4_ != 3)) goto LAB_00130eff;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
      ::operator++(&__end1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"children",&local_319);
    local_2f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 *)uVar2,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    children = (value *)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                        ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                               *)typeName.field_2._8_8_);
    bVar3 = std::operator!=(&local_2f8,(_Self *)&children);
    if (bVar3) {
      ppVar15 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                ::operator->(&local_2f8);
      this_05 = &ppVar15->second;
      bVar3 = picojson::value::is<std::vector<picojson::value,std::allocator<picojson::value>>>
                        (this_05);
      if (bVar3) {
        paVar16 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                            (this_05);
        __end3 = std::vector<picojson::value,_std::allocator<picojson::value>_>::begin(paVar16);
        child.u_ = (_storage)
                   std::vector<picojson::value,_std::allocator<picojson::value>_>::end(paVar16);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                                           *)&child.u_), bVar3) {
          pvVar17 = __gnu_cxx::
                    __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                    ::operator*(&__end3);
          picojson::value::value((value *)((long)&padding.field_2 + 8),pvVar17);
          bVar3 = buildObject(this,(value *)((long)&padding.field_2 + 8),(Object *)classIt._M_node,
                              clazz);
          if (!bVar3) {
            this_local._7_1_ = 0;
          }
          id.field_2._9_3_ = 0;
          id.field_2._M_local_buf[8] = !bVar3;
          picojson::value::~value((value *)((long)&padding.field_2 + 8));
          if (id.field_2._8_4_ != 0) goto LAB_00130eff;
          __gnu_cxx::
          __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
          ::operator++(&__end3);
        }
        goto LAB_00130d41;
      }
      bVar3 = picojson::value::
              is<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                        (this_05);
      if (bVar3) {
        bVar3 = buildObject(this,this_05,(Object *)classIt._M_node,clazz);
        if (bVar3) goto LAB_00130d41;
        this_local._7_1_ = 0;
        id.field_2._8_4_ = 1;
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,"error: object id=");
        poVar6 = std::operator<<(poVar6,(string *)local_88);
        poVar6 = std::operator<<(poVar6," of class=");
        poVar6 = std::operator<<(poVar6,(string *)local_58);
        poVar6 = std::operator<<(poVar6,", has invalid children, must be JSON array or object");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        id.field_2._8_4_ = 1;
      }
    }
    else {
LAB_00130d41:
      if ((this->m_verbose & 1U) != 0) {
        std::__cxx11::string::string((string *)&p);
        for (local_380 = parent; local_380 != (Object *)0x0; local_380 = local_380->parent) {
          std::__cxx11::string::operator+=((string *)&p,"  ");
        }
        poVar6 = std::operator<<((ostream *)&std::cerr," - object: ");
        poVar6 = std::operator<<(poVar6,(string *)&p);
        poVar6 = std::operator<<(poVar6,"id=");
        poVar6 = std::operator<<(poVar6,(string *)local_88);
        poVar6 = std::operator<<(poVar6,", class=");
        poVar6 = std::operator<<(poVar6,(string *)local_58);
        poVar6 = std::operator<<(poVar6,", children=");
        sVar18 = std::vector<Object_*,_std::allocator<Object_*>_>::size
                           ((vector<Object_*,_std::allocator<Object_*>_> *)(classIt._M_node + 3));
        this_06 = (void *)std::ostream::operator<<(poVar6,sVar18);
        std::ostream::operator<<(this_06,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&p);
      }
      if (parent == (Object *)0x0) {
        clazz->root = (Object *)classIt._M_node;
      }
      else {
        std::vector<Object_*,_std::allocator<Object_*>_>::push_back
                  (&parent->children,(value_type *)&classIt);
      }
      this_local._7_1_ = 1;
      id.field_2._8_4_ = 1;
    }
LAB_00130eff:
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "error: object has empty or missing \'class\' in class=\'");
    poVar6 = std::operator<<(poVar6,(string *)clazz);
    poVar6 = std::operator<<(poVar6,"\', ");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
    id.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_58);
LAB_00130f2b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ObjectModelBuilder::buildObject(const picojson::value &value, Object *parent, Class *clazz)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: 'root' entry in class='" << clazz->name << "' is not a JSON object..." << std::endl;
        return false;
    }

    const picojson::object &object = value.get<picojson::object>();

    std::string typeName = findStringInObject(object, "class");
    if (typeName.empty()) {
        std::cerr << "error: object has empty or missing 'class' in class='" << clazz->name << "', " << std::endl;
        return false;
    }

    std::string id = uniqueIdentifier(clazz, (findStringInObject(object, "id")));

    Object *instance = new Object();
    instance->parent = parent;
    instance->id = id;

    auto classIt = m_classes.find(typeName);
    if (classIt == m_classes.end()) {
        std::cerr << "error: unknown class=" << typeName << ", for object id=" << id << std::endl;
        return false;
    }
    instance->clazz = classIt->second;

    // Parse out the properties and values..
    for (auto member : object) {
        const std::string &key = member.first;

        // These are special cased above and below
        if (key == "children" || key == "id" || key == "class")
            continue;

        // Verify that the class in question actually has the property
        bool exists = false;
        for (auto classProperty : instance->clazz->properties) {
            if (classProperty.name == key) {
                exists = true;
                break;
            }
        }
        if (!exists) {
            std::cerr << "error: object id=" << id << ", class=" << typeName << ", unknown property=" << key << std::endl;
            return false;
        }

        const picojson::value &propertyValue = member.second;
        if (propertyValue.is<double>()) {
            instance->propertyValues[key] = Value::number(propertyValue.get<double>());
        } else if (propertyValue.is<std::string>()) {
            instance->propertyValues[key] = Value::string(propertyValue.get<std::string>());
        } else if (propertyValue.is<picojson::object>()) {
            const picojson::object &binding = propertyValue.get<picojson::object>();
            auto bind = binding.find("bind");
            auto to = binding.find("to");

            if (bind != binding.end() && bind->second.is<std::string>()
                && to != binding.end() && (to->second.is<std::string>() || to->second.is<picojson::array>())) {
                std::shared_ptr<Binding> binding(new Binding());
                if (to->second.is<std::string>()) {
                    if (!buildBindingDependency(binding.get(), to->second.get<std::string>(), instance, clazz)) {
                        std::cerr << "error: malformed binding dependency=" << to->second.get<std::string>() << ", in object id="
                                  << id << ", class=" << typeName << ", property=" << key << std::endl;
                        return false;
                    }
                } else {
                    for (auto i : to->second.get<picojson::array>()) {
                        if (!i.is<std::string>()) {
                            std::cerr << "error: binding dependency needs to be a JSON string, id=" << id << ", property="
                                      << key << ", class=" << typeName << std::endl;
                            return false;
                        }
                        if (!buildBindingDependency(binding.get(), i.get<std::string>(), instance, clazz)) {
                            std::cerr << "error: malformed binding dependency=" << i.get<std::string>() << ", in object id="
                                      << id << ", class=" << typeName << ", property=" << key << std::endl;
                            return false;
                        }
                    }
                }
                binding->expression = bind->second.get<std::string>();
                instance->propertyValues[key] = Value::binding(binding);
            } else {
                std::cerr << "error: malformed binding in object id=" << id << ", class=" << typeName
                          << ", property=" << key << std::endl;
                return false;
            }
        }
    }

    // Recursively traverse the children..
    auto childrenIt = object.find("children");
    if (childrenIt != object.end()) {
        const picojson::value &children = childrenIt->second;
        if (children.is<picojson::array>()) {
            for (auto child : children.get<picojson::array>())
                if (!buildObject(child, instance, clazz))
                    return false;
        } else if (children.is<picojson::object>()) {
            if (!buildObject(children, instance, clazz))
                return false;
        } else {
            std::cerr << "error: object id=" << id << " of class=" << typeName << ", has invalid children, must be JSON array or object" << std::endl;
            return false;
        }
    }

    if (m_verbose) {
        std::string padding;
        Object *p = parent;
        while (p) {
            padding += "  ";
            p = p->parent;
        }
        std::cerr << " - object: " << padding << "id=" << id << ", class=" << typeName << ", children=" << instance->children.size() << std::endl;
    }

    if (parent)
        parent->children.push_back(instance);
    else
        clazz->root = instance;

    return true;
}